

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

bool __thiscall
soplex::SPxFastRT<double>::maxReEnter
          (SPxFastRT<double> *this,double *sel,double maxabs,SPxId *id,int nr,bool polish)

{
  UpdateVector<double> *pUVar1;
  UpdateVector<double> *w;
  pointer pdVar2;
  pointer pdVar3;
  SPxSolverBase<double> *pSVar4;
  VectorBase<double> *pVVar5;
  int iVar6;
  VectorBase<double> *pVVar7;
  VectorBase<double> *pVVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  pSVar4 = (this->super_SPxRatioTester<double>).thesolver;
  pUVar1 = pSVar4->thePvec;
  w = pSVar4->theCoPvec;
  iVar6 = (id->super_DataKey).info * pSVar4->theRep;
  if (iVar6 < 0) {
    if (0 < pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.costat)->data[nr]) {
      SSVectorBase<double>::clearIdx(&w->thedelta,nr);
      return true;
    }
    pVVar8 = pSVar4->theCoUbound;
    pVVar7 = pSVar4->theCoLbound;
    dVar9 = (w->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[nr];
    dVar10 = (w->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
    pVVar5 = pVVar8;
    if (dVar10 < 0.0) {
      pVVar5 = pVVar7;
    }
  }
  else {
    if (iVar6 == 0) {
      return true;
    }
    pVVar8 = pSVar4->theUbound;
    pVVar7 = pSVar4->theLbound;
    dVar9 = SVectorBase<double>::operator*
                      ((SVectorBase<double> *)
                       ((pSVar4->thevectors->set).theitem + (pSVar4->thevectors->set).thekey[nr].idx
                       ),&w->super_VectorBase<double>);
    (pUVar1->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[nr] = dVar9;
    pSVar4 = (this->super_SPxRatioTester<double>).thesolver;
    if (0 < pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.stat)->data[nr]) {
      SSVectorBase<double>::clearIdx(&pUVar1->thedelta,nr);
      return true;
    }
    dVar10 = (pUVar1->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
    pVVar5 = pVVar8;
    if (dVar10 < 0.0) {
      pVVar5 = pVVar7;
    }
  }
  dVar11 = ((pVVar5->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[nr] - dVar9) / dVar10;
  *sel = dVar11;
  pdVar2 = (pVVar8->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pdVar2[nr] != pdVar3[nr]) || (NAN(pdVar2[nr]) || NAN(pdVar3[nr]))) {
    if ((dVar11 < -this->fastDelta / maxabs) && (*sel = 0.0, !polish)) {
      if (dVar10 <= 0.0) {
        pSVar4->theShift = pSVar4->theShift + pdVar3[nr];
        pdVar3[nr] = dVar9;
        pSVar4->theShift = pSVar4->theShift - dVar9;
      }
      else {
        pSVar4->theShift = pSVar4->theShift - pdVar2[nr];
        pdVar2[nr] = dVar9;
        pSVar4->theShift = dVar9 + pSVar4->theShift;
      }
    }
  }
  else {
    *sel = 0.0;
    if (!polish) {
      if (dVar9 <= pdVar2[nr]) {
        dVar10 = pdVar3[nr] - dVar9;
      }
      else {
        dVar10 = dVar9 - pdVar2[nr];
      }
      pSVar4->theShift = dVar10 + pSVar4->theShift;
      pdVar3[nr] = dVar9;
      pdVar2[nr] = dVar9;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}